

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scanner_boundary.cpp
# Opt level: O2

bool __thiscall
duckdb::CSVIterator::Next
          (CSVIterator *this,CSVBufferManager *buffer_manager,CSVReaderOptions *reader_options)

{
  idx_t *piVar1;
  ulong uVar2;
  CSVBufferHandle *pCVar3;
  idx_t iVar4;
  bool bVar5;
  ulong uVar6;
  shared_ptr<duckdb::CSVBufferHandle,_true> buffer;
  shared_ptr<duckdb::CSVBufferHandle,_true> next_buffer;
  undefined1 local_40 [24];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_28;
  
  if (this->is_set != true) {
    return false;
  }
  uVar2 = (reader_options->maximum_line_size).value;
  uVar6 = (reader_options->buffer_size_option).value >> 2 & 0xfffffffffffffffc;
  if (uVar6 <= uVar2) {
    uVar6 = uVar2;
  }
  this->first_one = false;
  piVar1 = &(this->boundary).boundary_idx;
  *piVar1 = *piVar1 + 1;
  CSVBufferManager::GetBuffer((CSVBufferManager *)local_40,(idx_t)buffer_manager);
  pCVar3 = shared_ptr<duckdb::CSVBufferHandle,_true>::operator->
                     ((shared_ptr<duckdb::CSVBufferHandle,_true> *)local_40);
  if ((pCVar3->is_last_buffer == true) &&
     (iVar4 = (this->boundary).buffer_pos,
     pCVar3 = shared_ptr<duckdb::CSVBufferHandle,_true>::operator->
                        ((shared_ptr<duckdb::CSVBufferHandle,_true> *)local_40),
     pCVar3->actual_size < iVar4 + uVar6)) {
LAB_00abcedc:
    bVar5 = false;
  }
  else {
    iVar4 = (this->boundary).buffer_pos;
    pCVar3 = shared_ptr<duckdb::CSVBufferHandle,_true>::operator->
                       ((shared_ptr<duckdb::CSVBufferHandle,_true> *)local_40);
    if (iVar4 + uVar6 < pCVar3->actual_size) {
      iVar4 = (this->boundary).buffer_pos + uVar6;
      (this->boundary).buffer_pos = iVar4;
    }
    else {
      (this->boundary).buffer_idx = (this->boundary).buffer_idx + 1;
      (this->boundary).buffer_pos = 0;
      CSVBufferManager::GetBuffer((CSVBufferManager *)(local_40 + 0x10),(idx_t)buffer_manager);
      ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_28);
      if (local_40._16_8_ == 0) goto LAB_00abcedc;
      iVar4 = (this->boundary).buffer_pos;
    }
    (this->boundary).end_pos = uVar6 + iVar4;
    (this->pos).buffer_idx = (this->boundary).buffer_idx;
    (this->pos).buffer_pos = iVar4;
    bVar5 = true;
  }
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_40 + 8));
  return bVar5;
}

Assistant:

bool CSVIterator::Next(CSVBufferManager &buffer_manager, const CSVReaderOptions &reader_options) {
	if (!is_set) {
		return false;
	}
	const auto bytes_per_thread = BytesPerThread(reader_options);

	// If we are calling next this is not the first one anymore
	first_one = false;
	boundary.boundary_idx++;
	// This is our start buffer
	auto buffer = buffer_manager.GetBuffer(boundary.buffer_idx);
	if (buffer->is_last_buffer && boundary.buffer_pos + bytes_per_thread > buffer->actual_size) {
		// 1) We are done with the current file
		return false;
	} else if (boundary.buffer_pos + bytes_per_thread >= buffer->actual_size) {
		// 2) We still have data to scan in this file, we set the iterator accordingly.
		// We must move the buffer
		boundary.buffer_idx++;
		boundary.buffer_pos = 0;
		// Verify this buffer really exists
		auto next_buffer = buffer_manager.GetBuffer(boundary.buffer_idx);
		if (!next_buffer) {
			return false;
		}

	} else {
		// 3) We are not done with the current buffer, hence we just move where we start within the buffer
		boundary.buffer_pos += bytes_per_thread;
	}
	boundary.end_pos = boundary.buffer_pos + bytes_per_thread;
	SetCurrentPositionToBoundary();
	return true;
}